

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 03_signal_epoll.c
# Opt level: O2

void setup_signals(int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  char *__s;
  sigaction sa;
  
  if (1 < argc) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtol(argv[1],(char **)0x0,10);
    if (*piVar2 == 0) {
      if (lVar3 == 0) goto LAB_00101439;
      printf("Alarm after %ld seconds.\n",lVar3);
      sigemptyset((sigset_t *)&sa.sa_mask);
      sa.sa_flags = 0x10000000;
      sa.__sigaction_handler.sa_handler = sigalrm_handler;
      iVar1 = sigaction(0xe,(sigaction *)&sa,(sigaction *)0x0);
      if (iVar1 != -1) {
        alarm((uint)lVar3);
        return;
      }
      __s = "sigaction";
    }
    else {
      __s = "strtol()";
    }
    perror(__s);
    exit(1);
  }
LAB_00101439:
  puts("No alarm set. Will not be interrupted.");
  return;
}

Assistant:

void setup_signals(int argc, char **argv) {
    struct sigaction sa;

    /* No argument passed, and so no signal will be delivered */
    if (argc < 2) {
        printf("No alarm set. Will not be interrupted.\n");
        return;
    }

    /*  if a proper number is passed, we setup the alarm,
     * else we return without setting one up.
     * */
    errno = 0;
    long alarm_after = strtol(argv[1], NULL, 10);
    if (errno)
        handle_error("strtol()");
    if (alarm_after)
        printf("Alarm after %ld seconds.\n", alarm_after);
    else {
        printf("No alarm set. Will not be interrupted.\n");
        return;
    }

    /*
     * Setup a signal handler for the SIGALRM signal
     * */
    sigemptyset(&sa.sa_mask);
    sa.sa_flags = SA_RESTART;
    sa.sa_handler = sigalrm_handler;
    if (sigaction(SIGALRM, &sa, NULL) == -1)
        handle_error("sigaction");

    /*
     * Let's send ourselves a SIGALRM signal specified
     * seconds later.
     * */
    alarm(alarm_after);
}